

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.h
# Opt level: O2

void __thiscall
psql::
channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
::write<psql::parse_message>
          (channel<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
           *this,parse_message *msg,bool write_msg_type)

{
  size_t sVar1;
  size_t sVar2;
  uint *puVar3;
  undefined7 in_register_00000011;
  type x2;
  uint uVar4;
  serialization_context local_38;
  mutable_buffers_1 local_30;
  
  sVar1 = (msg->name).super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.
          value._M_len;
  sVar2 = (msg->statement).
          super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>.value._M_len;
  uVar4 = (int)sVar2 + 8 + (int)sVar1;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->shared_buff_,
             (CONCAT71(in_register_00000011,write_msg_type) & 0xffffffff) + sVar2 + sVar1 + 8);
  puVar3 = (uint *)(this->shared_buff_).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  if ((int)CONCAT71(in_register_00000011,write_msg_type) != 0) {
    *(uchar *)puVar3 = 'P';
    puVar3 = (uint *)((long)puVar3 + 1);
  }
  *puVar3 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 * 0x1000000;
  local_38.first_ = (uint8_t *)(puVar3 + 1);
  serialize_struct<0ul,psql::parse_message>(msg,&local_38);
  local_30.super_mutable_buffer.data_ =
       (this->shared_buff_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_30.super_mutable_buffer.size_ =
       (long)(this->shared_buff_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish - (long)local_30.super_mutable_buffer.data_;
  if (local_30.super_mutable_buffer.size_ == 0) {
    local_30.super_mutable_buffer.data_ = (pointer)0x0;
  }
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
            (this->stream_,&local_30,(type *)0x0);
  return;
}

Assistant:

void write(const Message& msg, bool write_msg_type=true)
	{
		serialization_context ctx;

		std::size_t effective_size = 4 + get_size(msg, ctx);
		std::size_t buffer_size = effective_size +  (write_msg_type ? 1 : 0);

		shared_buff_.resize(buffer_size);
		ctx.set_first(shared_buff_.data());

		if (write_msg_type)
		{
			serialize(Message::message_type, ctx);
		}
		serialize(std::uint32_t(effective_size), ctx);
		serialize(msg, ctx);

		boost::asio::write(stream_, boost::asio::buffer(shared_buff_));
	}